

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_BeginPlay(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  long *plVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  undefined4 in_register_00000014;
  undefined8 uVar4;
  char *__assertion;
  bool bVar5;
  undefined1 auVar6 [16];
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  uVar4 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      plVar1 = (long *)(param->field_0).field_1.a;
      if (plVar1 != (long *)0x0) {
        if (plVar1[1] == 0) {
          auVar6 = (**(code **)*plVar1)(plVar1);
          uVar4 = auVar6._8_8_;
          plVar1[1] = auVar6._0_8_;
        }
        pPVar3 = (PClass *)plVar1[1];
        bVar5 = pPVar3 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar5;
        uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),bVar5);
        defaultparam = (TArray<VMValue,_VMValue> *)(ulong)(pPVar3 == pPVar2 || bVar5);
        if (pPVar3 != pPVar2 && !bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar3 != (PClass *)0x0);
            if (pPVar3 == pPVar2) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042ed62;
        }
      }
      (**(code **)(*plVar1 + 0x50))(plVar1,defaultparam,uVar4,ret);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042ed62:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x12a5,
                "int AF_AActor_BeginPlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, BeginPlay)
{
	PARAM_SELF_PROLOGUE(AActor);
	self->BeginPlay();
	return 0;
}